

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlReaderNewFile(xmlTextReaderPtr reader,char *filename,char *encoding,int options)

{
  xmlParserInputBufferPtr input_00;
  xmlParserInputBufferPtr input;
  int options_local;
  char *encoding_local;
  char *filename_local;
  xmlTextReaderPtr reader_local;
  
  if (filename == (char *)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else {
    input_00 = xmlParserInputBufferCreateFilename(filename,XML_CHAR_ENCODING_NONE);
    if (input_00 == (xmlParserInputBufferPtr)0x0) {
      reader_local._4_4_ = -1;
    }
    else {
      reader_local._4_4_ = xmlTextReaderSetup(reader,input_00,filename,encoding,options);
    }
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlReaderNewFile(xmlTextReaderPtr reader, const char *filename,
                 const char *encoding, int options)
{
    xmlParserInputBufferPtr input;

    if (filename == NULL)
        return (-1);
    if (reader == NULL)
        return (-1);

    input =
        xmlParserInputBufferCreateFilename(filename,
                                           XML_CHAR_ENCODING_NONE);
    if (input == NULL)
        return (-1);
    return (xmlTextReaderSetup(reader, input, filename, encoding, options));
}